

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O0

void Unserialize<ParamsStream<AutoFile&,TransactionSerParams>,CTxIn,std::allocator<CTxIn>>
               (ParamsStream<AutoFile_&,_TransactionSerParams> *is,
               vector<CTxIn,_std::allocator<CTxIn>_> *v)

{
  long lVar1;
  vector<CTxIn,_std::allocator<CTxIn>_> *in_RSI;
  ParamsStream<AutoFile_&,_TransactionSerParams> *in_RDI;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  Using<VectorFormatter<DefaultFormatter>,std::vector<CTxIn,std::allocator<CTxIn>>&>(in_RSI);
  Unserialize<ParamsStream<AutoFile_&,_TransactionSerParams>,_Wrapper<VectorFormatter<DefaultFormatter>,_std::vector<CTxIn,_std::allocator<CTxIn>_>_&>_>
            (in_RDI,(Wrapper<VectorFormatter<DefaultFormatter>,_std::vector<CTxIn,_std::allocator<CTxIn>_>_&>
                     *)0xf9d526);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Unserialize(Stream& is, std::vector<T, A>& v)
{
    if constexpr (BasicByte<T>) { // Use optimized version for unformatted basic bytes
        // Limit size per read so bogus size value won't cause out of memory
        v.clear();
        unsigned int nSize = ReadCompactSize(is);
        unsigned int i = 0;
        while (i < nSize) {
            unsigned int blk = std::min(nSize - i, (unsigned int)(1 + 4999999 / sizeof(T)));
            v.resize(i + blk);
            is.read(AsWritableBytes(Span{&v[i], blk}));
            i += blk;
        }
    } else {
        Unserialize(is, Using<VectorFormatter<DefaultFormatter>>(v));
    }
}